

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::push_pop_messages(DebugMessageTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  DebugMessageTestContext *local_10;
  DebugMessageTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Push/Pop Debug Group",&local_31);
  NegativeTestShared::NegativeTestContext::beginSection(&ctx->super_NegativeTestContext,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glPushDebugGroup
            ((CallLogWrapper *)local_10,0x824a,1,-1,"Application group 1");
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x8269);
  glu::CallLogWrapper::glPushDebugGroup
            ((CallLogWrapper *)local_10,0x824a,2,-1,"Application group 1-1");
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x8269);
  glu::CallLogWrapper::glPushDebugGroup
            ((CallLogWrapper *)local_10,0x824a,3,-1,"Application group 1-1-1");
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)local_10);
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x826a);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)local_10);
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x826a);
  glu::CallLogWrapper::glPushDebugGroup
            ((CallLogWrapper *)local_10,0x824a,4,-1,"Application group 1-2");
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)local_10);
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x826a);
  glu::CallLogWrapper::glPushDebugGroup
            ((CallLogWrapper *)local_10,0x8249,4,-1,"3rd Party group 1-3");
  DebugMessageTestContext::expectMessage(local_10,0x8249,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)local_10);
  DebugMessageTestContext::expectMessage(local_10,0x8249,0x826a);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)local_10);
  DebugMessageTestContext::expectMessage(local_10,0x824a,0x826a);
  glu::CallLogWrapper::glPushDebugGroup((CallLogWrapper *)local_10,0x8249,4,-1,"3rd Party group 2");
  DebugMessageTestContext::expectMessage(local_10,0x8249,0x8269);
  glu::CallLogWrapper::glPopDebugGroup((CallLogWrapper *)local_10);
  DebugMessageTestContext::expectMessage(local_10,0x8249,0x826a);
  NegativeTestShared::NegativeTestContext::endSection(&local_10->super_NegativeTestContext);
  return;
}

Assistant:

void push_pop_messages (DebugMessageTestContext& ctx)
{
	ctx.beginSection("Push/Pop Debug Group");

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Application group 1");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 2, -1, "Application group 1-1");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 3, -1, "Application group 1-1-1");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 4, -1, "Application group 1-2");
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_THIRD_PARTY, 4, -1, "3rd Party group 1-3");
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_POP_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP);

	ctx.glPushDebugGroup(GL_DEBUG_SOURCE_THIRD_PARTY, 4, -1, "3rd Party group 2");
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_PUSH_GROUP);
	ctx.glPopDebugGroup();
	ctx.expectMessage(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_POP_GROUP);

	ctx.endSection();
}